

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

nng_err nni_http_set_uri(nng_http *conn,char *uri,char *query)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  nng_err nVar6;
  char *fmt;
  
  if (query == (char *)0x0) {
    uVar5 = strlen(uri);
    fmt = "%s%s";
    query = "";
  }
  else {
    pcVar2 = strchr(uri,0x3f);
    fmt = "%s&%s";
    if (pcVar2 == (char *)0x0) {
      fmt = "%s?%s";
    }
    sVar3 = strlen(uri);
    sVar4 = strlen(query);
    uVar5 = sVar4 + sVar3 + 1;
  }
  pcVar2 = conn->uri;
  if (pcVar2 != (char *)0x0) {
    iVar1 = strcmp(uri,pcVar2);
    if ((iVar1 == 0) && (*query == '\0')) {
      return NNG_OK;
    }
    if (pcVar2 != conn->ubuf) {
      nni_strfree(pcVar2);
    }
  }
  if (uVar5 < 200) {
    nVar6 = NNG_OK;
    snprintf(conn->ubuf,200,fmt,uri,query);
    conn->uri = conn->ubuf;
  }
  else {
    iVar1 = nni_asprintf(&conn->uri,fmt,uri,query);
    nVar6 = (uint)(iVar1 != 0) * 2;
  }
  return nVar6;
}

Assistant:

nng_err
nni_http_set_uri(nng_http *conn, const char *uri, const char *query)
{
	size_t      needed;
	const char *fmt;

	if (query != NULL) {
		fmt    = strchr(uri, '?') != NULL ? "%s&%s" : "%s?%s";
		needed = strlen(uri) + strlen(query) + 1;
	} else {
		fmt    = "%s%s";
		query  = "";
		needed = strlen(uri);
	}

	if (conn->uri != NULL && (strcmp(uri, conn->uri) == 0) &&
	    strlen(query) == 0) {
		// no change, do nothing
		return (NNG_OK);
	}
	if (conn->uri != NULL && conn->uri != conn->ubuf) {
		nni_strfree(conn->uri);
	}

	// fast path, small size URI fits in our buffer
	if (needed < sizeof(conn->ubuf)) {
		snprintf(conn->ubuf, sizeof(conn->ubuf), fmt, uri, query);
		conn->uri = conn->ubuf;
		return (NNG_OK);
	}

	// too big, we have to allocate it (slow path)
	if (nni_asprintf(&conn->uri, fmt, uri, query) != 0) {
		return (NNG_ENOMEM);
	}
	return (NNG_OK);
}